

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Scene::~Scene(Scene *this)

{
  XFormWidget *this_00;
  
  this_00 = this->elementTransform;
  if (this_00 != (XFormWidget *)0x0) {
    XFormWidget::~XFormWidget(this_00);
    operator_delete(this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->selectionInfo);
  std::
  _Rb_tree<CMU462::DynamicScene::SceneLight_*,_CMU462::DynamicScene::SceneLight_*,_std::_Identity<CMU462::DynamicScene::SceneLight_*>,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  ::~_Rb_tree(&(this->lights)._M_t);
  std::
  _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Scene::~Scene() {
  if (elementTransform != nullptr) {
    delete elementTransform;
  }
}